

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine_ft.cpp
# Opt level: O0

QImage * __thiscall
QFontEngineFT::alphaMapForGlyph
          (QFontEngineFT *this,glyph_t g,QFixedPoint *subPixelPosition,QTransform *t)

{
  long lVar1;
  TransformationType TVar2;
  GlyphFormat glyphFormat;
  Glyph *pGVar3;
  undefined8 in_RCX;
  undefined4 in_EDX;
  long in_RSI;
  QImage *in_RDI;
  Glyph *in_R8;
  long in_FS_OFFSET;
  QColor in_stack_00000010;
  Glyph *glyph;
  GlyphFormat neededFormat;
  bool needsImageTransform;
  QImage *img;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff1c;
  bool local_b1;
  bool disableOutlineDrawing;
  undefined1 in_stack_ffffffffffffff6f;
  QTransform *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff7c;
  GlyphFormat format;
  glyph_t g_00;
  undefined4 in_stack_ffffffffffffff90;
  TransformationMode in_stack_ffffffffffffffb4;
  QTransform *in_stack_ffffffffffffffb8;
  QImage *in_stack_ffffffffffffffc0;
  Glyph *local_10;
  
  g_00 = (glyph_t)((ulong)in_RCX >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  disableOutlineDrawing = false;
  if ((*(ulong *)(**(long **)(in_RSI + 0xf8) + 0x10) & 1) == 0) {
    TVar2 = QTransform::type((QTransform *)
                             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    disableOutlineDrawing = 1 < (int)TVar2;
  }
  format = CONCAT13(disableOutlineDrawing,(int3)in_stack_ffffffffffffff7c);
  local_b1 = true;
  if ((*(byte *)(in_RSI + 0x108) & 1) == 0) {
    local_b1 = disableOutlineDrawing;
  }
  glyphFormat = Format_Mono;
  if (local_b1 != false) {
    glyphFormat = Format_A8;
  }
  pGVar3 = in_R8;
  QColor::QColor((QColor *)0xa678e1);
  uVar4 = 1;
  pGVar3 = loadGlyphFor((QFontEngineFT *)CONCAT44(in_EDX,in_stack_ffffffffffffff90),g_00,
                        (QFixedPoint *)pGVar3,format,in_stack_ffffffffffffff70,in_stack_00000010,
                        (bool)in_stack_ffffffffffffff6f,disableOutlineDrawing);
  (in_RDI->super_QPaintDevice)._vptr_QPaintDevice = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(in_RDI->super_QPaintDevice).painters = &DAT_aaaaaaaaaaaaaaaa;
  in_RDI->d = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  alphaMapFromGlyphData(in_R8,glyphFormat);
  if ((format & 0x1000000) == Format_None) {
    QRect::QRect((QRect *)local_10);
    QImage::copy((QImage *)&stack0xffffffffffffffb8,(QRect *)in_RDI);
    QImage::operator=((QImage *)CONCAT44(in_stack_ffffffffffffff1c,uVar4),(QImage *)local_10);
    QImage::~QImage((QImage *)local_10);
  }
  else {
    QImage::transformed(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                        in_stack_ffffffffffffffb4);
    QImage::operator=((QImage *)CONCAT44(in_stack_ffffffffffffff1c,uVar4),(QImage *)local_10);
    QImage::~QImage((QImage *)local_10);
  }
  if ((((*(byte *)(in_RSI + 0x115) & 1) == 0) && (pGVar3 != &emptyGlyph)) &&
     (pGVar3 != (Glyph *)0x0)) {
    QFontEngine::Glyph::~Glyph(local_10);
    operator_delete(pGVar3,0x18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QImage QFontEngineFT::alphaMapForGlyph(glyph_t g,
                                       const QFixedPoint &subPixelPosition,
                                       const QTransform &t)
{
    const bool needsImageTransform = !FT_IS_SCALABLE(freetype->face)
            && t.type() > QTransform::TxTranslate;
    const GlyphFormat neededFormat = antialias || needsImageTransform ? Format_A8 : Format_Mono;

    Glyph *glyph = loadGlyphFor(g, subPixelPosition, neededFormat, t, QColor(), false, true);

    QImage img = alphaMapFromGlyphData(glyph, neededFormat);
    if (needsImageTransform)
        img = img.transformed(t, Qt::FastTransformation);
    else
        img = img.copy();

    if (!cacheEnabled && glyph != &emptyGlyph)
        delete glyph;

    return img;
}